

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var * __thiscall cs::domain_manager::get_var(domain_manager *this,string *name)

{
  bool bVar1;
  var *pvVar2;
  string *str;
  domain_type *in_RDI;
  domain_type *domain_1;
  iterator __end2;
  iterator __begin2;
  stack_type<cs::domain_type,_std::allocator> *__range2;
  domain_type *domain;
  iterator __end3;
  iterator __begin3;
  stack_type<cs::domain_type,_std::allocator> *__range3;
  stack_type<cs::domain_type,_std::allocator> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff5c;
  domain_type *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  iterator local_50;
  iterator local_48;
  shared_ptr<cs::domain_ref> *local_40;
  domain_type *local_38;
  iterator local_30;
  iterator local_28;
  undefined8 local_20;
  
  if (*(long *)(in_RDI->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_ != 0) {
    local_20 = *(undefined8 *)
                (in_RDI->m_reflect).
                super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                .
                super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                .ctrl_;
    local_28 = stack_type<cs::domain_type,_std::allocator>::begin(in_stack_ffffffffffffff48);
    local_30 = stack_type<cs::domain_type,_std::allocator>::end(in_stack_ffffffffffffff48);
    while (bVar1 = stack_type<cs::domain_type,_std::allocator>::iterator::operator!=
                             (&local_28,&local_30), bVar1) {
      local_38 = stack_type<cs::domain_type,_std::allocator>::iterator::operator*(&local_28);
      bVar1 = domain_type::exist(in_RDI,(string *)in_stack_ffffffffffffff48);
      if (bVar1) {
        pvVar2 = domain_type::get_var_no_check
                           (in_stack_ffffffffffffff60,
                            (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
        ;
        return pvVar2;
      }
      stack_type<cs::domain_type,_std::allocator>::iterator::operator++(&local_28);
    }
  }
  local_40 = &in_RDI->m_ref;
  local_48 = stack_type<cs::domain_type,_std::allocator>::begin(in_stack_ffffffffffffff48);
  local_50 = stack_type<cs::domain_type,_std::allocator>::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = stack_type<cs::domain_type,_std::allocator>::iterator::operator!=(&local_48,&local_50);
    if (!bVar1) {
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
      str = (string *)__cxa_allocate_exception(0x28);
      std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff5c,uVar3),(char *)in_RDI);
      runtime_error::runtime_error((runtime_error *)in_RDI,str);
      __cxa_throw(str,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    stack_type<cs::domain_type,_std::allocator>::iterator::operator*(&local_48);
    bVar1 = domain_type::exist(in_RDI,(string *)in_stack_ffffffffffffff48);
    if (bVar1) break;
    stack_type<cs::domain_type,_std::allocator>::iterator::operator++(&local_48);
  }
  pvVar2 = domain_type::get_var_no_check
                     (in_stack_ffffffffffffff60,
                      (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  return pvVar2;
}

Assistant:

inline var &get_var(const std::string &name)
		{
			if (fiber_stack != nullptr) {
				for (auto &domain: *fiber_stack)
					if (domain.exist(name))
						return domain.get_var_no_check(name);
			}
			for (auto &domain: m_data)
				if (domain.exist(name))
					return domain.get_var_no_check(name);
			throw runtime_error("Use of undefined variable \"" + name + "\".");
		}